

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

ParseStatus ParseVP8X(WebPDemuxer *dmux)

{
  size_t sVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  undefined2 uVar5;
  int iVar6;
  uint32_t uVar7;
  uint8_t *puVar8;
  size_t sVar9;
  Frame *pFVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  Chunk *pCVar14;
  size_t sVar15;
  Frame *frame;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ParseStatus PVar19;
  MemBuffer *mem;
  size_t sVar20;
  uint uVar21;
  ParseStatus PVar22;
  ulong uVar23;
  
  sVar20 = (dmux->mem).start;
  sVar15 = (dmux->mem).end;
  if (7 < sVar15 - sVar20) {
    dmux->is_ext_format = 1;
    (dmux->mem).start = sVar20 + 4;
    puVar8 = (dmux->mem).buf;
    uVar21 = *(uint *)(puVar8 + sVar20 + 4);
    sVar1 = sVar20 + 8;
    (dmux->mem).start = sVar1;
    if (uVar21 + 9 < 0x13) {
      return PARSE_ERROR;
    }
    uVar21 = (uVar21 & 1) + uVar21;
    sVar9 = (dmux->mem).riff_end;
    if (sVar9 - sVar1 < (ulong)uVar21) {
      return PARSE_ERROR;
    }
    if ((ulong)uVar21 <= sVar15 - sVar1) {
      dmux->feature_flags = (uint)puVar8[sVar20 + 8];
      (dmux->mem).start = sVar20 + 0xc;
      uVar4 = *(ushort *)(puVar8 + sVar20 + 0xc);
      bVar2 = puVar8[sVar20 + 0xe];
      (dmux->mem).start = sVar20 + 0xf;
      uVar12 = (uint)uVar4 + (uint)bVar2 * 0x10000 + 1;
      dmux->canvas_width = uVar12;
      uVar4 = *(ushort *)(puVar8 + sVar20 + 0xf);
      bVar2 = puVar8[sVar20 + 0x11];
      (dmux->mem).start = sVar20 + 0x12;
      uVar16 = (uint)bVar2 * 0x10000 + (uint)uVar4 + 1;
      dmux->canvas_height = uVar16;
      if ((int)((ulong)uVar12 * (ulong)uVar16 >> 0x20) != 0) {
        return PARSE_ERROR;
      }
      sVar20 = sVar20 + 0x12 + (ulong)(uVar21 - 10);
      (dmux->mem).start = sVar20;
      dmux->state = WEBP_DEMUX_PARSED_HEADER;
      if (sVar9 - sVar20 < 8) {
        return PARSE_ERROR;
      }
      if (sVar15 - sVar20 < 8) {
        return PARSE_NEED_MORE_DATA;
      }
      uVar21 = dmux->feature_flags;
      sVar20 = (dmux->mem).start;
      bVar11 = false;
      do {
        puVar8 = (dmux->mem).buf;
        iVar6 = *(int *)(puVar8 + sVar20);
        (dmux->mem).start = sVar20 + 4;
        uVar12 = *(uint *)(puVar8 + sVar20 + 4);
        sVar15 = sVar20 + 8;
        (dmux->mem).start = sVar15;
        if (0xfffffff6 < (ulong)uVar12) {
          return PARSE_ERROR;
        }
        uVar16 = (uVar12 & 1) + uVar12;
        uVar23 = (ulong)uVar16;
        if ((dmux->mem).riff_end - sVar15 < uVar23) {
          return PARSE_ERROR;
        }
        if (iVar6 < 0x48504c41) {
          if (iVar6 < 0x46495845) {
            if (iVar6 == 0x20385056) {
LAB_00105924:
              if (bVar11) {
                return PARSE_ERROR;
              }
              if ((uVar21 & 2) != 0) {
                return PARSE_ERROR;
              }
              (dmux->mem).start = sVar20;
              PVar19 = ParseSingleImage(dmux);
              bVar11 = false;
              goto LAB_00105a62;
            }
            if (iVar6 != 0x20504d58) goto LAB_001059fe;
            iVar17 = 2;
          }
          else {
            if (iVar6 != 0x46495845) {
              if (iVar6 != 0x464d4e41) goto LAB_001059fe;
              if (!bVar11) {
                return PARSE_ERROR;
              }
              bVar11 = true;
              PVar19 = PARSE_ERROR;
              if (0xf < uVar16) {
                if ((dmux->mem).end - sVar15 < 0x10) {
                  PVar19 = PARSE_NEED_MORE_DATA;
                }
                else {
                  uVar12 = dmux->feature_flags;
                  frame = (Frame *)WebPSafeCalloc(1,0x50);
                  if (frame != (Frame *)0x0) {
                    sVar20 = (dmux->mem).start;
                    puVar8 = (dmux->mem).buf;
                    uVar4 = *(ushort *)(puVar8 + sVar20);
                    bVar2 = puVar8[sVar20 + 2];
                    (dmux->mem).start = sVar20 + 3;
                    frame->x_offset = (uint)bVar2 * 0x20000 + (uint)uVar4 * 2;
                    uVar4 = *(ushort *)(puVar8 + sVar20 + 3);
                    bVar2 = puVar8[sVar20 + 5];
                    (dmux->mem).start = sVar20 + 6;
                    frame->y_offset = (uint)bVar2 * 0x20000 + (uint)uVar4 * 2;
                    uVar4 = *(ushort *)(puVar8 + sVar20 + 6);
                    bVar2 = puVar8[sVar20 + 8];
                    (dmux->mem).start = sVar20 + 9;
                    uVar13 = (uint)uVar4 + (uint)bVar2 * 0x10000 + 1;
                    frame->width = uVar13;
                    uVar4 = *(ushort *)(puVar8 + sVar20 + 9);
                    bVar2 = puVar8[sVar20 + 0xb];
                    (dmux->mem).start = sVar20 + 0xc;
                    uVar18 = (uint)uVar4 + (uint)bVar2 * 0x10000 + 1;
                    frame->height = uVar18;
                    uVar5 = *(undefined2 *)(puVar8 + sVar20 + 0xc);
                    uVar3 = puVar8[sVar20 + 0xe];
                    (dmux->mem).start = sVar20 + 0xf;
                    frame->duration = (uint)CONCAT12(uVar3,uVar5);
                    bVar2 = puVar8[sVar20 + 0xf];
                    (dmux->mem).start = sVar20 + 0x10;
                    frame->dispose_method = bVar2 & WEBP_MUX_DISPOSE_BACKGROUND;
                    frame->blend_method = bVar2 >> 1 & WEBP_MUX_NO_BLEND;
                    if ((int)((ulong)uVar13 * (ulong)uVar18 >> 0x20) == 0) {
                      PVar19 = StoreFrame(dmux->num_frames + 1,uVar16 - 0x10,&dmux->mem,frame);
                      PVar22 = PARSE_ERROR;
                      if (PVar19 != PARSE_ERROR) {
                        PVar22 = PVar19;
                        if ((ulong)(uVar16 - 0x10) < (dmux->mem).start - (sVar20 + 0x10)) {
                          PVar22 = PARSE_ERROR;
                        }
                        if (((PVar22 != PARSE_ERROR) && ((uVar12 & 2) != 0)) &&
                           (PVar22 = PVar19, 0 < frame->frame_num)) {
                          pFVar10 = *dmux->frames_tail;
                          if ((pFVar10 == (Frame *)0x0) ||
                             (PVar22 = PARSE_ERROR, pFVar10->complete != 0)) {
                            *dmux->frames_tail = frame;
                            frame->next = (Frame *)0x0;
                            dmux->frames_tail = &frame->next;
                            dmux->num_frames = dmux->num_frames + 1;
                            goto LAB_00105a62;
                          }
                        }
                      }
                      PVar19 = PVar22;
                      WebPSafeFree(frame);
                    }
                    else {
                      WebPSafeFree(frame);
                    }
                  }
                }
              }
              goto LAB_00105a62;
            }
            iVar17 = 3;
          }
LAB_001059aa:
          PVar19 = PARSE_NEED_MORE_DATA;
          if ((dmux->mem).end - sVar15 < uVar23) goto LAB_00105a62;
          if ((dmux->feature_flags >> iVar17 & 1) != 0) {
LAB_00105a0f:
            pCVar14 = (Chunk *)WebPSafeCalloc(1,0x18);
            if (pCVar14 == (Chunk *)0x0) {
              return PARSE_ERROR;
            }
            (pCVar14->data).offset = sVar20;
            (pCVar14->data).size = (ulong)uVar12 + 8;
            *dmux->chunks_tail = pCVar14;
            pCVar14->next = (Chunk *)0x0;
            dmux->chunks_tail = &pCVar14->next;
            sVar15 = (dmux->mem).start;
          }
LAB_00105a5a:
          (dmux->mem).start = sVar15 + uVar23;
LAB_00105a60:
          PVar19 = PARSE_OK;
        }
        else if (iVar6 < 0x4d494e41) {
          if ((iVar6 == 0x48504c41) || (iVar6 == 0x4c385056)) goto LAB_00105924;
LAB_001059fe:
          PVar19 = PARSE_NEED_MORE_DATA;
          if (uVar23 <= (dmux->mem).end - sVar15) goto LAB_00105a0f;
        }
        else {
          if (iVar6 != 0x4d494e41) {
            iVar17 = 5;
            if (iVar6 == 0x50434349) goto LAB_001059aa;
            if (iVar6 == 0x58385056) {
              return PARSE_ERROR;
            }
            goto LAB_001059fe;
          }
          if (uVar16 < 6) {
            return PARSE_ERROR;
          }
          PVar19 = PARSE_NEED_MORE_DATA;
          if (uVar23 <= (dmux->mem).end - sVar15) {
            if (bVar11) {
              if (uVar23 <= (dmux->mem).end - sVar15) goto LAB_00105a5a;
              goto LAB_00105a62;
            }
            uVar7 = *(uint32_t *)(puVar8 + sVar20 + 8);
            (dmux->mem).start = sVar20 + 0xc;
            dmux->bgcolor = uVar7;
            dmux->loop_count = (uint)*(ushort *)(puVar8 + sVar20 + 0xc);
            (dmux->mem).start = (uVar16 - 6) + sVar20 + 0xe;
            bVar11 = true;
            goto LAB_00105a60;
          }
        }
LAB_00105a62:
        sVar20 = (dmux->mem).start;
        if (sVar20 == (dmux->mem).riff_end) {
          return PVar19;
        }
        if ((dmux->mem).end - sVar20 < 8) {
          PVar19 = PARSE_NEED_MORE_DATA;
        }
        if (PVar19 != PARSE_OK) {
          return PVar19;
        }
      } while( true );
    }
  }
  return PARSE_NEED_MORE_DATA;
}

Assistant:

static ParseStatus ParseVP8X(WebPDemuxer* const dmux) {
  MemBuffer* const mem = &dmux->mem;
  uint32_t vp8x_size;

  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  dmux->is_ext_format = 1;
  Skip(mem, TAG_SIZE);  // VP8X
  vp8x_size = ReadLE32(mem);
  if (vp8x_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;
  if (vp8x_size < VP8X_CHUNK_SIZE) return PARSE_ERROR;
  vp8x_size += vp8x_size & 1;
  if (SizeIsInvalid(mem, vp8x_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < vp8x_size) return PARSE_NEED_MORE_DATA;

  dmux->feature_flags = ReadByte(mem);
  Skip(mem, 3);  // Reserved.
  dmux->canvas_width  = 1 + ReadLE24s(mem);
  dmux->canvas_height = 1 + ReadLE24s(mem);
  if (dmux->canvas_width * (uint64_t)dmux->canvas_height >= MAX_IMAGE_AREA) {
    return PARSE_ERROR;  // image final dimension is too large
  }
  Skip(mem, vp8x_size - VP8X_CHUNK_SIZE);  // skip any trailing data.
  dmux->state = WEBP_DEMUX_PARSED_HEADER;

  if (SizeIsInvalid(mem, CHUNK_HEADER_SIZE)) return PARSE_ERROR;
  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  return ParseVP8XChunks(dmux);
}